

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  int i;
  long lVar2;
  
  puVar1 = (undefined8 *)malloc(0x14);
  *puVar1 = 0x200000001;
  puVar1[1] = 0x400000003;
  *(undefined4 *)(puVar1 + 2) = 5;
  lVar2 = 0;
  do {
    printf("%i ",(ulong)*(uint *)((long)puVar1 + lVar2 * 4));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  putchar(10);
  free(puVar1);
  puVar1 = (undefined8 *)malloc(0xd);
  *puVar1 = 0x6f57206f6c6c6548;
  *(undefined8 *)((long)puVar1 + 5) = 0x21646c726f5720;
  printf("char_ptr = %s\n",puVar1);
  free(puVar1);
  return 0;
}

Assistant:

int main() {

    int nums[] = {1, 2, 3, 4, 5};

    int *num_ptr;

    num_ptr = (int *)malloc(5 * sizeof(int));

    for (int i = 0; i < sizeof(nums)/sizeof(int); i++) {
        num_ptr[i] = nums[i];
    }

    for (int i = 0; i < sizeof(nums)/sizeof(int); i++) {
        printf("%i ", num_ptr[i]);
    }
    printf("\n");

    free(num_ptr);

    /* char str[] = {'h','e','l','l','o','\0'}; */
    char *str = "Hello World!";

    char *char_ptr;

    char_ptr = (char *)malloc(strlen(str)+1);

    /*
    for (int i = 0; i < strlen(str) + 1; i++) {
        char_ptr[i] = str[i];
    }
    */
    strcpy(char_ptr, str);

    printf("char_ptr = %s\n", char_ptr);

    free(char_ptr);

    return 0;
}